

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx *dctx,size_t maxWindowSize)

{
  ulong in_RSI;
  long in_RDI;
  ZSTD_bounds ZVar1;
  size_t max;
  size_t min;
  ZSTD_bounds bounds;
  undefined8 local_8;
  
  ZVar1 = ZSTD_dParam_getBounds(ZSTD_d_windowLogMax);
  if (*(int *)(in_RDI + 0x7618) == 0) {
    if (in_RSI < (ulong)(1L << ((byte)ZVar1.lowerBound & 0x3f))) {
      local_8 = 0xffffffffffffffd6;
    }
    else if ((ulong)(1L << ((byte)ZVar1.upperBound & 0x3f)) < in_RSI) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      *(ulong *)(in_RDI + 0x7638) = in_RSI;
      local_8 = 0;
    }
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx* dctx, size_t maxWindowSize)
{
    ZSTD_bounds const bounds = ZSTD_dParam_getBounds(ZSTD_d_windowLogMax);
    size_t const min = (size_t)1 << bounds.lowerBound;
    size_t const max = (size_t)1 << bounds.upperBound;
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    RETURN_ERROR_IF(maxWindowSize < min, parameter_outOfBound, "");
    RETURN_ERROR_IF(maxWindowSize > max, parameter_outOfBound, "");
    dctx->maxWindowSize = maxWindowSize;
    return 0;
}